

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O1

void init_staticCache(staticCache *Cache,int size)

{
  static_record_data *psVar1;
  
  if (Cache->is_init != false) {
    return;
  }
  init_hashtable(&Cache->table,size,0.75,_hash_label,compare_static_record_data_with_label);
  psVar1 = (static_record_data *)malloc((long)size * 0x40 + 0x80);
  Cache->data = psVar1;
  Cache->top = 0;
  Cache->size = size;
  Cache->is_init = true;
  return;
}

Assistant:

void init_staticCache(struct staticCache* Cache,int size){
  if(Cache->is_init==false){
    init_hashtable(&Cache->table,size,0.75,_hash_label,compare_static_record_data_with_label);
    Cache->data = (struct static_record_data*)malloc((size+2)*sizeof(struct static_record_data));
    Cache->top = 0;
    Cache->size = size;
    Cache->is_init = true;
  }
}